

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_check_outgoing_commands
              (ENetHost *host,ENetPeer *peer,ENetList *sentUnreliableCommands)

{
  short sVar1;
  short sVar2;
  _ENetListNode *p_Var3;
  ushort uVar4;
  bool bVar5;
  int iVar6;
  void *data;
  sbyte sVar7;
  ulong uVar8;
  ENetChannel *local_98;
  uint local_8c;
  ENetChannel *local_78;
  enet_uint16 unreliableSequenceNumber;
  enet_uint16 reliableSequenceNumber;
  enet_uint32 windowSize;
  int canPing;
  int windowWrap;
  size_t commandSize;
  enet_uint16 reliableWindow;
  ENetChannel *channel;
  ENetListIterator currentSendReliableCommand;
  ENetListIterator currentCommand;
  ENetOutgoingCommand *outgoingCommand;
  ENetBuffer *buffer;
  ENetProtocol *command;
  ENetList *sentUnreliableCommands_local;
  ENetPeer *peer_local;
  ENetHost *host_local;
  
  buffer = (ENetBuffer *)(host->commands + host->commandCount);
  outgoingCommand = (ENetOutgoingCommand *)(host->buffers + host->bufferCount);
  bVar5 = false;
  _unreliableSequenceNumber = 1;
  currentSendReliableCommand = (peer->outgoingCommands).sentinel.next;
  channel = (ENetChannel *)(peer->outgoingSendReliableCommands).sentinel.next;
LAB_0010982c:
  if (currentSendReliableCommand == &(peer->outgoingCommands).sentinel) {
    if (channel == (ENetChannel *)&peer->outgoingSendReliableCommands) goto LAB_00109eda;
LAB_00109896:
    currentCommand = (ENetListIterator)channel;
    channel = *(ENetChannel **)channel;
  }
  else {
    currentCommand = currentSendReliableCommand;
    if ((channel != (ENetChannel *)&peer->outgoingSendReliableCommands) &&
       (86399999 <
        (uint)(*(int *)(channel->reliableWindows + 0xb) -
              *(int *)((long)&currentSendReliableCommand[1].previous + 4)))) goto LAB_00109896;
    currentSendReliableCommand = currentSendReliableCommand->next;
  }
  if (((ulong)currentCommand[2].previous & 0x80) != 0) {
    if ((ulong)*(byte *)((long)&currentCommand[2].previous + 1) < peer->channelCount) {
      local_78 = peer->channels + *(byte *)((long)&currentCommand[2].previous + 1);
    }
    else {
      local_78 = (ENetChannel *)0x0;
    }
    uVar4 = *(ushort *)&currentCommand[1].next / 0x1000;
    if (local_78 != (ENetChannel *)0x0) goto code_r0x00109926;
    goto LAB_001099d6;
  }
  goto LAB_00109a66;
code_r0x00109926:
  if (!bVar5) {
    if (((*(short *)((long)&currentCommand[2].next + 6) != 0) ||
        ((uint)*(ushort *)&currentCommand[1].next % 0x1000 != 0)) ||
       ((local_78->reliableWindows[(int)((uVar4 + 0xf) % 0x10)] < 0x1000 &&
        (sVar7 = (sbyte)uVar4,
        ((uint)local_78->usedReliableWindows & (0x3ff << sVar7 | 0x3ffU >> (0x10U - sVar7 & 0x1f)))
        == 0)))) {
LAB_001099d6:
      if (currentCommand[5].previous != (_ENetListNode *)0x0) {
        local_8c = peer->packetThrottle * peer->windowSize >> 5;
        if (local_8c <= peer->mtu) {
          local_8c = peer->mtu;
        }
        if (local_8c <
            peer->reliableDataInTransit + (uint)*(ushort *)((long)&currentCommand[2].next + 4)) {
          channel = (ENetChannel *)&peer->outgoingSendReliableCommands;
          goto LAB_0010982c;
        }
      }
      _unreliableSequenceNumber = 0;
LAB_00109a66:
      p_Var3 = (_ENetListNode *)commandSizes[(int)(*(byte *)&currentCommand[2].previous & 0xf)];
      if ((((&host->field_0x672 <= buffer) ||
           (&host->bufferCount <= &outgoingCommand->reliableSequenceNumber)) ||
          ((_ENetListNode *)((ulong)peer->mtu - host->packetSize) < p_Var3)) ||
         ((currentCommand[5].previous != (_ENetListNode *)0x0 &&
          ((ushort)((short)peer->mtu - (short)host->packetSize) <
           (ushort)((short)p_Var3 + *(short *)((long)&currentCommand[2].next + 4)))))) {
        peer->flags = peer->flags | 2;
LAB_00109eda:
        host->commandCount = ((long)buffer - (long)host->commands) / 0x30;
        host->bufferCount = (long)outgoingCommand - (long)host->buffers >> 4;
        if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
            (iVar6 = enet_peer_has_outgoing_commands(peer), iVar6 == 0)) &&
           ((sentUnreliableCommands->sentinel).next == &sentUnreliableCommands->sentinel)) {
          enet_peer_disconnect(peer,peer->eventData);
        }
        return _unreliableSequenceNumber;
      }
      if (((ulong)currentCommand[2].previous & 0x80) == 0) {
        if ((currentCommand[5].previous != (_ENetListNode *)0x0) &&
           (*(int *)&currentCommand[2].next == 0)) {
          peer->packetThrottleCounter = peer->packetThrottleCounter + 7;
          peer->packetThrottleCounter = peer->packetThrottleCounter & 0x1f;
          if (peer->packetThrottle < peer->packetThrottleCounter) {
            sVar1 = *(short *)&currentCommand[1].next;
            sVar2 = *(short *)((long)&currentCommand[1].next + 2);
            while( true ) {
              (currentCommand[5].previous)->next =
                   (_ENetListNode *)((long)&(currentCommand[5].previous)->next[-1].previous + 7);
              if ((currentCommand[5].previous)->next == (_ENetListNode *)0x0) {
                enet_packet_destroy((ENetPacket *)currentCommand[5].previous);
              }
              enet_list_remove(currentCommand);
              enet_free(currentCommand);
              if (((currentSendReliableCommand == &(peer->outgoingCommands).sentinel) ||
                  (currentCommand = currentSendReliableCommand,
                  *(short *)&currentSendReliableCommand[1].next != sVar1)) ||
                 (*(short *)((long)&currentSendReliableCommand[1].next + 2) != sVar2)) break;
              currentSendReliableCommand = currentSendReliableCommand->next;
            }
            goto LAB_0010982c;
          }
        }
        enet_list_remove(currentCommand);
        if (currentCommand[5].previous != (_ENetListNode *)0x0) {
          enet_list_insert(&sentUnreliableCommands->sentinel,currentCommand);
        }
      }
      else {
        if ((ulong)*(byte *)((long)&currentCommand[2].previous + 1) < peer->channelCount) {
          local_98 = peer->channels + *(byte *)((long)&currentCommand[2].previous + 1);
        }
        else {
          local_98 = (ENetChannel *)0x0;
        }
        uVar4 = *(ushort *)&currentCommand[1].next / 0x1000;
        if ((local_98 != (ENetChannel *)0x0) && (*(short *)((long)&currentCommand[2].next + 6) == 0)
           ) {
          local_98->usedReliableWindows =
               local_98->usedReliableWindows | (ushort)(1 << (sbyte)uVar4);
          local_98->reliableWindows[uVar4] = local_98->reliableWindows[uVar4] + 1;
        }
        *(short *)((long)&currentCommand[2].next + 6) =
             *(short *)((long)&currentCommand[2].next + 6) + 1;
        if (*(int *)&currentCommand[1].previous == 0) {
          *(enet_uint32 *)&currentCommand[1].previous =
               peer->roundTripTime + peer->roundTripTimeVariance * 4;
        }
        if ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel) {
          peer->nextTimeout = host->serviceTime + *(int *)&currentCommand[1].previous;
        }
        data = enet_list_remove(currentCommand);
        enet_list_insert(&(peer->sentReliableCommands).sentinel,data);
        *(enet_uint32 *)((long)&currentCommand[1].next + 4) = host->serviceTime;
        host->headerFlags = host->headerFlags | 0x8000;
        peer->reliableDataInTransit =
             (uint)*(ushort *)((long)&currentCommand[2].next + 4) + peer->reliableDataInTransit;
      }
      (outgoingCommand->outgoingCommandList).next = (_ENetListNode *)buffer;
      (outgoingCommand->outgoingCommandList).previous = p_Var3;
      host->packetSize =
           (long)&((outgoingCommand->outgoingCommandList).previous)->next + host->packetSize;
      memcpy(buffer,&currentCommand[2].previous,0x30);
      if (currentCommand[5].previous == (_ENetListNode *)0x0) {
        if (((ulong)currentCommand[2].previous & 0x80) == 0) {
          enet_free(currentCommand);
        }
      }
      else {
        *(ulong *)&outgoingCommand->reliableSequenceNumber =
             (long)&(currentCommand[5].previous[1].next)->next +
             (ulong)*(uint *)&currentCommand[2].next;
        uVar8 = (ulong)*(ushort *)((long)&currentCommand[2].next + 4);
        outgoingCommand->roundTripTimeout = (int)uVar8;
        outgoingCommand->queueTime = (int)(uVar8 >> 0x20);
        host->packetSize = (ulong)*(ushort *)((long)&currentCommand[2].next + 4) + host->packetSize;
        outgoingCommand = (ENetOutgoingCommand *)&outgoingCommand->reliableSequenceNumber;
      }
      peer->packetsSent = peer->packetsSent + 1;
      peer->totalPacketsSent = peer->totalPacketsSent + 1;
      buffer = buffer + 3;
      outgoingCommand = (ENetOutgoingCommand *)&outgoingCommand->reliableSequenceNumber;
      goto LAB_0010982c;
    }
    bVar5 = true;
    channel = (ENetChannel *)&peer->outgoingSendReliableCommands;
  }
  goto LAB_0010982c;
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost *host, ENetPeer *peer, ENetList *sentUnreliableCommands) {
        ENetProtocol *command = &host->commands[host->commandCount];
        ENetBuffer *buffer    = &host->buffers[host->bufferCount];
        ENetOutgoingCommand *outgoingCommand = NULL;
        ENetListIterator currentCommand, currentSendReliableCommand;
        ENetChannel *channel = NULL;
        enet_uint16 reliableWindow = 0;
        size_t commandSize=0;
        int windowWrap = 0, canPing = 1;

        currentCommand = enet_list_begin(&peer->outgoingCommands);
        currentSendReliableCommand = enet_list_begin (&peer->outgoingSendReliableCommands);

        for (;;) {
            if (currentCommand != enet_list_end (& peer->outgoingCommands))
            {
                outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands) && ENET_TIME_LESS (((ENetOutgoingCommand *) currentSendReliableCommand)->queueTime, outgoingCommand->queueTime)) {
                    goto useSendReliableCommand;
                }
                currentCommand = enet_list_next (currentCommand);
            } else if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands)) {
                useSendReliableCommand:
                outgoingCommand = (ENetOutgoingCommand *) currentSendReliableCommand;
                currentSendReliableCommand = enet_list_next (currentSendReliableCommand);
            } else {
                break;
            }


            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL) {
                    if (windowWrap) {
                        continue;
                    } else if (outgoingCommand->sendAttempts < 1 && 
                            !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
                            (channel->reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                            channel->usedReliableWindows & ((((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | 
                            (((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow))))) 
                    {
                        windowWrap = 1;
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                if (outgoingCommand->packet != NULL) {
                    enet_uint32 windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX (windowSize, peer->mtu))
                    {
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                canPing = 0;
            }

            commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];
            if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] ||
                buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] ||
                peer->mtu - host->packetSize < commandSize ||
                (outgoingCommand->packet != NULL &&
                (enet_uint16) (peer->mtu - host->packetSize) < (enet_uint16) (commandSize + outgoingCommand->fragmentLength))
            ) {
                peer->flags |= ENET_PEER_FLAG_CONTINUE_SENDING;
                break;
            }

            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL && outgoingCommand->sendAttempts < 1) {
                    channel->usedReliableWindows |= 1u << reliableWindow;
                    ++channel->reliableWindows[reliableWindow];
                }

                ++outgoingCommand->sendAttempts;

                if (outgoingCommand->roundTripTimeout == 0) {
                    outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
                }

                if (enet_list_empty(&peer->sentReliableCommands)) {
                    peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;
                }

                enet_list_insert(enet_list_end(&peer->sentReliableCommands), enet_list_remove(&outgoingCommand->outgoingCommandList));

                outgoingCommand->sentTime = host->serviceTime;

                host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
                peer->reliableDataInTransit += outgoingCommand->fragmentLength;
            } else {
                if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0) {
                    peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
                    peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->packetThrottleCounter > peer->packetThrottle) {
                        enet_uint16 reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,
                                    unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;
                        for (;;)
                        {
                            --outgoingCommand->packet->referenceCount;

                            if (outgoingCommand->packet->referenceCount == 0) {
                                enet_packet_destroy(outgoingCommand->packet);
                            }

                            enet_list_remove(& outgoingCommand->outgoingCommandList);
                            enet_free(outgoingCommand);

                            if (currentCommand == enet_list_end (& peer->outgoingCommands)) {
                                break;
                            }

                            outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                            if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber ||
                                outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber) {
                                break;
                            }

                            currentCommand = enet_list_next(currentCommand);
                        }

                        continue;
                    }
                }

                enet_list_remove(&outgoingCommand->outgoingCommandList);

                if (outgoingCommand->packet != NULL) {
                    enet_list_insert(enet_list_end (sentUnreliableCommands), outgoingCommand);
                }
            }


            buffer->data       = command;
            buffer->dataLength = commandSize;

            host->packetSize  += buffer->dataLength;

            *command = outgoingCommand->command;

            if (outgoingCommand->packet != NULL) {
                ++buffer;
                buffer->data       = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
                buffer->dataLength = outgoingCommand->fragmentLength;
                host->packetSize += outgoingCommand->fragmentLength;
            } else if(! (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
                enet_free(outgoingCommand);
            }

            ++peer->packetsSent;
            ++peer->totalPacketsSent;

            ++command;
            ++buffer;
        }

        host->commandCount = command - host->commands;
        host->bufferCount  = buffer - host->buffers;

        if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER &&
            !enet_peer_has_outgoing_commands (peer) &&
            enet_list_empty (sentUnreliableCommands)) {
                enet_peer_disconnect (peer, peer->eventData);
            }

        return canPing;
    }